

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
* mocker::nasm::getInvolvedRegs
            (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             *__return_storage_ptr__,shared_ptr<mocker::nasm::Inst> *inst)

{
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ud;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  defined;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  used;
  unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  unique;
  allocator_type local_93;
  undefined1 local_92;
  undefined1 local_91;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_90;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_78;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_60;
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_48;
  
  getUsedRegs(&local_60,inst);
  getDefinedRegs(&local_78,inst);
  anon_unknown_52::merge(&local_90,&local_60,&local_78);
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<std::shared_ptr<mocker::nasm::Register>*,std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>>>
            ((_Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&local_48,
             local_90.
             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_90.
             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,0,&local_93,&local_91,&local_92);
  std::
  vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>
  ::vector<std::__detail::_Node_iterator<std::shared_ptr<mocker::nasm::Register>,true,true>,void>
            ((vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>
              *)__return_storage_ptr__,
             (_Node_iterator<std::shared_ptr<mocker::nasm::Register>,_true,_true>)
             local_48._M_before_begin._M_nxt,
             (_Node_iterator<std::shared_ptr<mocker::nasm::Register>,_true,_true>)0x0,&local_93);
  std::
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_48);
  std::
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::~vector(&local_90);
  std::
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::~vector(&local_78);
  std::
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::~vector(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<Register>>
getInvolvedRegs(const std::shared_ptr<Inst> &inst) {
  auto used = getUsedRegs(inst);
  auto defined = getDefinedRegs(inst);
  auto ud = merge(used, defined);
  std::unordered_set<std::shared_ptr<Register>, RegPtrHash, RegPtrEqual> unique(
      ud.begin(), ud.end());
  return std::vector<std::shared_ptr<Register>>(unique.begin(), unique.end());
}